

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O0

uint __thiscall
pktalloc::CustomBitSet<64U>::FindFirstSet(CustomBitSet<64U> *this,uint bitStart,uint bitEnd)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint i;
  uint wordEnd;
  uint offset;
  WordT word;
  uint wordStart;
  uint bitEnd_local;
  uint bitStart_local;
  CustomBitSet<64U> *this_local;
  uint local_14;
  
  i = bitStart >> 6;
  uVar3 = this[i].Words[0] >> ((byte)bitStart & 0x3f);
  if (uVar3 == 0) {
    do {
      i = i + 1;
      if (bitEnd + 0x3f >> 6 <= i) {
        return bitEnd;
      }
      uVar3 = this[i].Words[0];
    } while (uVar3 == 0);
    iVar2 = 0;
    for (uVar1 = uVar3; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
      iVar2 = iVar2 + 1;
    }
    iVar2 = iVar2 + 1;
    if (uVar3 == 0) {
      iVar2 = 0;
    }
    local_14 = i * 0x40 + iVar2 + -1;
  }
  else {
    offset = 0;
    if ((uVar3 & 1) == 0) {
      iVar2 = 0;
      for (uVar1 = uVar3; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
        iVar2 = iVar2 + 1;
      }
      iVar2 = iVar2 + 1;
      if (uVar3 == 0) {
        iVar2 = 0;
      }
      offset = iVar2 - 1;
    }
    local_14 = bitStart + offset;
  }
  return local_14;
}

Assistant:

unsigned FindFirstSet(unsigned bitStart, unsigned bitEnd = kValidBits)
    {
        static_assert(kWordBits == 64, "Update this");

        unsigned wordStart = bitStart / kWordBits;

        WordT word = Words[wordStart] >> (bitStart % kWordBits);
        if (word != 0)
        {
            unsigned offset = 0;
            if ((word & 1) == 0) {
                offset = TrailingZeros64(word);
            }
            return bitStart + offset;
        }

        const unsigned wordEnd = (bitEnd + kWordBits - 1) / kWordBits;

        for (unsigned i = wordStart + 1; i < wordEnd; ++i)
        {
            word = Words[i];
            if (word != 0) {
                return i * kWordBits + TrailingZeros64(word);
            }
        }

        return bitEnd;
    }